

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O2

void Cmd_listlights(FCommandLine *argv,APlayerPawn *who,int key)

{
  TObjPtr<AActor> *obj;
  ushort uVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  PClass *pPVar5;
  PClass **ppPVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  TThinkerIterator<ADynamicLight> it;
  FThinkerIterator local_48;
  
  TThinkerIterator<ADynamicLight>::TThinkerIterator
            ((TThinkerIterator<ADynamicLight> *)&local_48,0x80);
  uVar12 = 0;
  uVar9 = 0;
  uVar13 = 0;
  uVar11 = 0;
  while( true ) {
    pAVar2 = (AActor *)FThinkerIterator::Next(&local_48);
    if (pAVar2 == (AActor *)0x0) break;
    obj = &pAVar2->target;
    pAVar3 = GC::ReadBarrier<AActor>((AActor **)obj);
    pAVar4 = pAVar2;
    if (pAVar3 != (AActor *)0x0) {
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    }
    pPVar5 = DObject::GetClass((DObject *)pAVar4);
    Printf("%s at (%f, %f, %f), color = 0x%02x%02x%02x, radius = %f ",(pAVar2->__Pos).X,
           (pAVar2->__Pos).Y,(pAVar2->__Pos).Z,pAVar2->radius,
           FName::NameData.NameArray[(pPVar5->super_PStruct).super_PNamedType.TypeName.Index].Text,
           (ulong)(uint)pAVar2->args[0]);
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    if (pAVar4 != (AActor *)0x0) {
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
      uVar1 = pAVar4->sprite;
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
      gl_GetSpriteFrame((uint)uVar1,(uint)pAVar4->frame,0,0,(bool *)0x0);
      Printf(", frame = %s ");
    }
    uVar11 = uVar11 + 1;
    pAVar4 = pAVar2 + 1;
    uVar10 = 0;
    while( true ) {
      pAVar4 = (AActor *)(pAVar4->super_DThinker).super_DObject.Class;
      if (pAVar4 == (AActor *)0x0) break;
      uVar10 = (ulong)((int)uVar10 + 1);
    }
    ppPVar6 = (PClass **)&pAVar2[1].super_DThinker.super_DObject.ObjNext;
    uVar12 = uVar12 + (int)uVar10;
    uVar7 = 0;
    while( true ) {
      if (*ppPVar6 == (PClass *)0x0) break;
      uVar7 = (ulong)((int)uVar7 + 1);
      ppPVar6 = &((*ppPVar6)->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                 super_DObject.Class;
    }
    uVar13 = uVar13 + (int)uVar7;
    uVar8 = 0;
    for (ppPVar6 = (PClass **)&pAVar2[1].super_DThinker.super_DObject.GCNext;
        *ppPVar6 != (PClass *)0x0;
        ppPVar6 = &((*ppPVar6)->super_PStruct).super_PNamedType.super_PCompoundType.super_PType.
                   super_DObject.Class) {
      uVar8 = uVar8 + 1;
    }
    Printf("- %d walls, %d subsectors, %d sectors\n",uVar10,uVar7,(ulong)uVar8);
    uVar9 = uVar9 + uVar8;
  }
  Printf("%i dynamic lights, %d walls, %d subsectors, %d sectors\n\n\n",(ulong)uVar11,(ulong)uVar12,
         (ulong)uVar13,(ulong)uVar9);
  return;
}

Assistant:

CCMD(listlights)
{
	int walls, sectors, subsecs;
	int allwalls=0, allsectors=0, allsubsecs = 0;
	int i=0;
	ADynamicLight * dl;
	TThinkerIterator<ADynamicLight> it;

	while ((dl=it.Next()))
	{
		walls=0;
		sectors=0;
		subsecs = 0;
		Printf("%s at (%f, %f, %f), color = 0x%02x%02x%02x, radius = %f ",
			dl->target? dl->target->GetClass()->TypeName.GetChars() : dl->GetClass()->TypeName.GetChars(),
			dl->X(), dl->Y(), dl->Z(), dl->args[LIGHT_RED], 
			dl->args[LIGHT_GREEN], dl->args[LIGHT_BLUE], dl->radius);
		i++;

		if (dl->target)
		{
			FTextureID spr = gl_GetSpriteFrame(dl->target->sprite, dl->target->frame, 0, 0, NULL);
			Printf(", frame = %s ", TexMan[spr]->Name.GetChars());
		}


		FLightNode * node;

		node=dl->touching_sides;

		while (node)
		{
			walls++;
			allwalls++;
			node = node->nextTarget;
		}

		node=dl->touching_subsectors;

		while (node)
		{
			allsubsecs++;
			subsecs++;
			node = node->nextTarget;
		}

		node = dl->touching_sector;

		while (node)
		{
			allsectors++;
			sectors++;
			node = node->nextTarget;
		}
		Printf("- %d walls, %d subsectors, %d sectors\n", walls, subsecs, sectors);

	}
	Printf("%i dynamic lights, %d walls, %d subsectors, %d sectors\n\n\n", i, allwalls, allsubsecs, allsectors);
}